

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-spbset.c
# Opt level: O2

_Bool Curl_uint_spbset_empty(uint_spbset *bset)

{
  long lVar1;
  long lVar2;
  
  for (; lVar2 = 1, &bset->head != (uint_spbset_chunk *)0x0;
      bset = (uint_spbset *)((uint_spbset_chunk *)&(bset->head).next)->next) {
    while (lVar2 != 5) {
      lVar1 = lVar2 + -1;
      lVar2 = lVar2 + 1;
      if ((bset->head).slots[lVar1] != 0) goto LAB_0015b2d4;
    }
  }
LAB_0015b2d4:
  return &bset->head == (uint_spbset_chunk *)0x0;
}

Assistant:

bool Curl_uint_spbset_empty(struct uint_spbset *bset)
{
  struct uint_spbset_chunk *chunk;
  unsigned int i;

  for(chunk = &bset->head; chunk; chunk = chunk->next) {
    for(i = 0; i < CURL_UINT_SPBSET_CH_SLOTS; ++i) {
      if(chunk->slots[i])
        return FALSE;
    }
  }
  return TRUE;
}